

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtomEscapePass1
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  uint uVar1;
  StandardChars<unsigned_char> *pSVar2;
  code *pcVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  EncodedChar EVar7;
  byte bVar8;
  Char CVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined4 *puVar14;
  ulong uVar15;
  MatchGroupNode *this_00;
  long lVar16;
  CharCount CVar17;
  uint uVar18;
  int iVar19;
  Char local_32 [4];
  Char c;
  
  if (this->inputLim <= this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x643,"(!IsEOF())","!IsEOF()");
    if (!bVar6) goto LAB_00d3644a;
    *puVar14 = 0;
  }
  pSVar2 = this->standardEncodedChars;
  EVar7 = ECLookahead(this,0);
  bVar6 = StandardChars<unsigned_char>::IsDigit(pSVar2,EVar7);
  EVar7 = ECLookahead(this,0);
  if (bVar6) {
    if (EVar7 != '0') {
      CVar17 = 0;
      iVar19 = 0;
      lVar5 = 2;
      do {
        lVar16 = lVar5;
        pSVar2 = this->standardEncodedChars;
        iVar4 = (int)lVar16;
        EVar7 = ECLookahead(this,iVar4 - 2);
        uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar2,EVar7);
        iVar19 = uVar10 + iVar19 * 10;
        if (lVar16 == 6) {
          CVar17 = 5;
          break;
        }
        if (this->inputLim < this->next + lVar16) {
          CVar17 = iVar4 - 1;
          break;
        }
        CVar17 = CVar17 + 1;
        pSVar2 = this->standardEncodedChars;
        EVar7 = ECLookahead(this,iVar4 - 1);
        bVar6 = StandardChars<unsigned_char>::IsDigit(pSVar2,EVar7);
        lVar5 = lVar16 + 1;
      } while (bVar6);
      if (iVar19 < (int)(uint)this->numGroups) {
        if (this->inputLim < this->next + lVar16) {
LAB_00d36013:
          ECConsume(this,CVar17);
          this_00 = (MatchGroupNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x35916e);
          MatchGroupNode::MatchGroupNode(this_00,iVar19);
          *node = (Node *)this_00;
          return false;
        }
        pSVar2 = this->standardEncodedChars;
        EVar7 = ECLookahead(this,CVar17);
        bVar6 = StandardChars<unsigned_char>::IsDigit(pSVar2,EVar7);
        if (!bVar6) goto LAB_00d36013;
      }
      pSVar2 = this->standardEncodedChars;
      EVar7 = ECLookahead(this,0);
      bVar6 = StandardChars<unsigned_char>::IsOctal(pSVar2,EVar7);
      if (!bVar6) {
        bVar6 = false;
        bVar8 = ECLookahead(this,0);
        deferredCharNode->cs[0] = (ushort)bVar8;
        ECConsume(this,1);
        goto LAB_00d36070;
      }
    }
    pSVar2 = this->standardEncodedChars;
    EVar7 = ECLookahead(this,0);
    bVar6 = StandardChars<unsigned_char>::IsOctal(pSVar2,EVar7);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x670,"(standardEncodedChars->IsOctal(ECLookahead()))",
                         "standardEncodedChars->IsOctal(ECLookahead())");
      if (!bVar6) {
LAB_00d3644a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar14 = 0;
    }
    iVar19 = 3;
    uVar18 = 0;
    do {
      pSVar2 = this->standardEncodedChars;
      EVar7 = ECLookahead(this,0);
      uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar2,EVar7);
      uVar1 = uVar10 + uVar18 * 8;
      if (0xff < uVar1) break;
      ECConsume(this,1);
      iVar19 = iVar19 + -1;
      uVar18 = uVar1;
      if (iVar19 == 0) break;
      pSVar2 = this->standardEncodedChars;
      EVar7 = ECLookahead(this,0);
      bVar6 = StandardChars<unsigned_char>::IsOctal(pSVar2,EVar7);
    } while (bVar6);
    CVar9 = Chars<char16_t>::UTC(uVar18 & 0xffff);
    deferredCharNode->cs[0] = CVar9;
    *node = &deferredCharNode->super_Node;
    return false;
  }
  if (EVar7 == 'c') {
    pSVar2 = this->standardEncodedChars;
    EVar7 = ECLookahead(this,1);
    bVar6 = StandardChars<unsigned_char>::IsLetter(pSVar2,EVar7);
    CVar9 = L'\\';
    if (bVar6) {
      bVar8 = ECLookahead(this,1);
      CVar9 = Chars<char16_t>::UTC((uint)(bVar8 & 0x1f));
      ECConsume(this,2);
    }
    deferredCharNode->cs[0] = CVar9;
    *node = &deferredCharNode->super_Node;
    return false;
  }
  local_32[0] = NextChar(this);
  switch(local_32[0]) {
  case L'S':
    EVar7 = 'S';
    goto LAB_00d363d4;
  case L'T':
  case L'U':
  case L'V':
  case L'X':
  case L'Y':
  case L'Z':
  case L'_':
  case L'`':
  case L'a':
  case L'c':
  case L'e':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'o':
  case L'p':
  case L'q':
  case L'y':
  case L'z':
    goto switchD_00d35e84_caseD_54;
  case L'W':
    EVar7 = 'W';
LAB_00d363d4:
    deferredCharNode = (MatchCharNode *)GetNodeWithValidCharacterSet(this,EVar7);
    goto LAB_00d35eb6;
  case L'[':
  case L'\\':
  case L']':
  case L'^':
  case L'{':
  case L'|':
  case L'}':
    break;
  case L'b':
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x35916e)
    ;
    bVar6 = false;
LAB_00d36424:
    WordBoundaryNode::WordBoundaryNode((WordBoundaryNode *)deferredCharNode,bVar6);
    bVar6 = true;
    goto LAB_00d36070;
  case L'd':
    bVar6 = false;
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetDigits
              (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    goto LAB_00d36070;
  case L'f':
    local_32[0] = L'\f';
    break;
  case L'n':
    local_32[0] = L'\n';
    break;
  case L'r':
    local_32[0] = L'\r';
    break;
  case L's':
    bVar6 = false;
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    StandardChars<char16_t>::SetWhitespace
              (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    goto LAB_00d36070;
  case L't':
    local_32[0] = L'\t';
    break;
  case L'u':
    if (((this->unicodeFlagPresent != true) ||
        (iVar19 = TryParseExtendedUnicodeEscape(this,local_32,previousSurrogatePart,false),
        iVar19 < 1)) && (this->next + 4 <= this->inputLim)) {
      pSVar2 = this->standardEncodedChars;
      EVar7 = ECLookahead(this,0);
      bVar6 = StandardChars<unsigned_char>::IsHex(pSVar2,EVar7);
      if (bVar6) {
        pSVar2 = this->standardEncodedChars;
        EVar7 = ECLookahead(this,1);
        bVar6 = StandardChars<unsigned_char>::IsHex(pSVar2,EVar7);
        if (bVar6) {
          pSVar2 = this->standardEncodedChars;
          EVar7 = ECLookahead(this,2);
          bVar6 = StandardChars<unsigned_char>::IsHex(pSVar2,EVar7);
          if (bVar6) {
            pSVar2 = this->standardEncodedChars;
            EVar7 = ECLookahead(this,3);
            bVar6 = StandardChars<unsigned_char>::IsHex(pSVar2,EVar7);
            if (bVar6) {
              pSVar2 = this->standardEncodedChars;
              EVar7 = ECLookahead(this,0);
              uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar2,EVar7);
              pSVar2 = this->standardEncodedChars;
              EVar7 = ECLookahead(this,1);
              uVar11 = StandardChars<unsigned_char>::DigitValue(pSVar2,EVar7);
              pSVar2 = this->standardEncodedChars;
              EVar7 = ECLookahead(this,2);
              uVar12 = StandardChars<unsigned_char>::DigitValue(pSVar2,EVar7);
              pSVar2 = this->standardEncodedChars;
              EVar7 = ECLookahead(this,3);
              uVar13 = StandardChars<unsigned_char>::DigitValue(pSVar2,EVar7);
              local_32[0] = Chars<char16_t>::UTC(uVar12 << 4 | uVar13 | uVar10 << 0xc | uVar11 << 8)
              ;
              CVar17 = 4;
              goto LAB_00d361ac;
            }
          }
        }
      }
    }
    break;
  case L'v':
    local_32[0] = L'\v';
    break;
  case L'w':
    deferredCharNode = (MatchCharNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e)
    ;
    MatchSetNode::MatchSetNode((MatchSetNode *)deferredCharNode,false,false);
    if ((this->unicodeFlagPresent == true) && (this->caseInsensitiveFlagPresent == true)) {
      StandardChars<char16_t>::SetWordIUChars
                (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    }
    else {
      StandardChars<char16_t>::SetWordChars
                (this->standardChars,this->ctAllocator,&((MatchSetNode *)deferredCharNode)->set);
    }
    goto LAB_00d35eb6;
  case L'x':
    if (this->next + 2 <= this->inputLim) {
      pSVar2 = this->standardEncodedChars;
      EVar7 = ECLookahead(this,0);
      bVar6 = StandardChars<unsigned_char>::IsHex(pSVar2,EVar7);
      if (bVar6) {
        pSVar2 = this->standardEncodedChars;
        EVar7 = ECLookahead(this,1);
        bVar6 = StandardChars<unsigned_char>::IsHex(pSVar2,EVar7);
        if (bVar6) {
          pSVar2 = this->standardEncodedChars;
          EVar7 = ECLookahead(this,0);
          uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar2,EVar7);
          pSVar2 = this->standardEncodedChars;
          EVar7 = ECLookahead(this,1);
          uVar11 = StandardChars<unsigned_char>::DigitValue(pSVar2,EVar7);
          local_32[0] = Chars<char16_t>::UTC(uVar10 << 4 | uVar11);
          CVar17 = 2;
LAB_00d361ac:
          ECConsume(this,CVar17);
        }
      }
    }
    break;
  default:
    uVar15 = (ulong)((ushort)local_32[0] - 0x24);
    if ((ushort)local_32[0] - 0x24 < 0x21) {
      if ((0x8000cf1UL >> (uVar15 & 0x3f) & 1) != 0) break;
      if (uVar15 == 0x1e) {
        deferredCharNode =
             (MatchCharNode *)new<Memory::ArenaAllocator>(0x40,this->ctAllocator,0x35916e);
        bVar6 = true;
        goto LAB_00d36424;
      }
      if (uVar15 == 0x20) {
        EVar7 = 'D';
        goto LAB_00d363d4;
      }
    }
    goto switchD_00d35e84_caseD_54;
  }
switchD_00d35e84_caseD_5b:
  deferredCharNode->cs[0] = local_32[0];
LAB_00d35eb6:
  bVar6 = false;
LAB_00d36070:
  *node = &deferredCharNode->super_Node;
  return bVar6;
switchD_00d35e84_caseD_54:
  if (this->unicodeFlagPresent == true) {
    Fail(this,-0x7ff5e9d6);
  }
  goto switchD_00d35e84_caseD_5b;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        Assert(!IsEOF()); // checked for terminating 0 in pass 0
        if (standardEncodedChars->IsDigit(ECLookahead()))
        {
            // As per Annex B, allow octal escapes as well as group references, disambiguate based on known
            // number of groups.
            if (ECLookahead() == '0')
            {
                // fall through for octal
            }
            else
            {
                // Could be a group reference, but only if between 1 and 5 digits which resolve to a valid group number
                int n = 0;
                CharCount digits = 0;
                do
                {
                    n = n * 10 + (int)standardEncodedChars->DigitValue(ECLookahead(digits));
                    digits++;
                }
                while (digits < 5 && ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits)));
                if (n >= numGroups ||
                    (ECCanConsume(digits + 1) && standardEncodedChars->IsDigit(ECLookahead(digits))))
                {
                    if (standardEncodedChars->IsOctal(ECLookahead()))
                    {
                        // fall through for octal
                    }
                    else
                    {
                        // \8 and \9 are identity escapes
                        deferredCharNode->cs[0] = Chars<EncodedChar>::CTW(ECLookahead());
                        ECConsume();
                        node = deferredCharNode;
                        return false; // not an assertion
                    }
                }
                else
                {
                    ECConsume(digits);
                    node = Anew(ctAllocator, MatchGroupNode, n);
                    return false; // not an assertion
                }
            }

            // Must be between 1 and 3 octal digits
            Assert(standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) // Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not an octal

            deferredCharNode->cs[0] = UTC((UChar)n);
            node = deferredCharNode;
            return false; // not an assertion
        }
        else if (ECLookahead() == 'c')
        {
            Char c;
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                c = UTC(Chars<EncodedChar>::CTU(ECLookahead(1)) % 32);
                ECConsume(2);
            }
            else
            {
                // SPEC DEVIATION: For non-letters or EOF, take the leading '\' to be itself, and
                //                 don't consume the 'c' or letter.
                c = '\\';
            }
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                node = Anew(ctAllocator, WordBoundaryNode, false);
                return true; // Is an assertion
            case 'B':
                node = Anew(ctAllocator, WordBoundaryNode, true);
                return true; // Is an assertion
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetDigits(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'D':
                {
                    node = GetNodeWithValidCharacterSet('D');
                    return false; // not an assertion
                }
            case 's':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    standardChars->SetWhitespace(ctAllocator, setNode->set);
                    node = setNode;
                    return false; // not an assertion
                }
            case 'S':
                {
                    node = GetNodeWithValidCharacterSet('S');
                    return false; // not an assertion
                }
            case 'w':
                {
                    MatchSetNode *setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    if (this->unicodeFlagPresent && this->caseInsensitiveFlagPresent)
                    {
                        standardChars->SetWordIUChars(ctAllocator, setNode->set);
                    }
                    else
                    {
                        standardChars->SetWordChars(ctAllocator, setNode->set);
                    }
                    node = setNode;
                    return false; // not an assertion
                }
            case 'W':
                {
                    node = GetNodeWithValidCharacterSet('W');
                    return false; // not an assertion
                }
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                        (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case '^':
            case '$':
            case '\\':
            case '.':
            case '*':
            case '+':
            case '?':
            case '(':
            case ')':
            case '[':
            case ']':
            case '{':
            case '}':
            case '|':
            case '/':
                break; // fall-through for identity escape
            default:
                if (this->unicodeFlagPresent)
                {
                    // As per #sec-forbidden-extensions, if unicode flag is present, we must disallow any other escape.
                    this->Fail(JSERR_RegExpInvalidEscape); // throw SyntaxError
                }
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            node = deferredCharNode;
            return false; // not an assertion
        }
    }